

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O2

xml_node __thiscall
pugi::xml_node::find_child<NULLCPugiXML::predicate_nullc_node>
          (xml_node *this,predicate_nullc_node pred)

{
  bool bVar1;
  unspecified_bool_type p_Var2;
  xml_node local_28;
  predicate_nullc_node local_20;
  
  local_20.callback.id = pred.callback.id;
  local_20.callback.context = pred.callback.context;
  if (this->_root != (xml_node_struct *)0x0) {
    local_28 = first_child(this);
    while (p_Var2 = operator_cast_to_function_pointer(&local_28),
          p_Var2 != (unspecified_bool_type)0x0) {
      bVar1 = NULLCPugiXML::predicate_nullc_node::operator()(&local_20,&local_28);
      if (bVar1) {
        return (xml_node)local_28._root;
      }
      local_28 = next_sibling(&local_28);
    }
  }
  xml_node(&local_28);
  return (xml_node)local_28._root;
}

Assistant:

xml_node find_child(Predicate pred) const
		{
			if (!_root) return xml_node();

			for (xml_node node = first_child(); node; node = node.next_sibling())
				if (pred(node))
					return node;

			return xml_node();
		}